

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

_Bool find_nearby_grid(chunk_conflict *c,loc *grid,loc centre,wchar_t yd,wchar_t xd)

{
  _Bool _Var1;
  loc top_left_00;
  loc bottom_right_00;
  loc bottom_right;
  loc top_left;
  wchar_t xd_local;
  wchar_t yd_local;
  loc *grid_local;
  chunk_conflict *c_local;
  loc centre_local;
  
  c_local._0_4_ = centre.x;
  c_local._4_4_ = centre.y;
  top_left_00 = loc((int)c_local - xd,c_local._4_4_ - yd);
  bottom_right_00 = loc((int)c_local + xd,c_local._4_4_ + yd);
  _Var1 = cave_find_in_range(c,grid,top_left_00,bottom_right_00,square_in_bounds_fully);
  return _Var1;
}

Assistant:

bool find_nearby_grid(struct chunk *c, struct loc *grid, struct loc centre,
	int yd, int xd)
{
	struct loc top_left = loc(centre.x - xd, centre.y - yd);
	struct loc bottom_right = loc(centre.x + xd, centre.y + yd);
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_in_bounds_fully);
}